

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void francisQR(double *A,int N)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *x;
  double *v;
  double *A_00;
  double *C;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double *local_88;
  double *local_68;
  
  x = (double *)malloc(0x18);
  v = (double *)malloc(0x18);
  lVar14 = (long)N;
  A_00 = (double *)malloc(lVar14 * 0x18);
  C = (double *)malloc(lVar14 * 8);
  uVar3 = N * N;
  dVar21 = A[(ulong)uVar3 - 1] + A[(long)(int)(uVar3 - N) + -2];
  dVar20 = *A;
  dVar1 = A[lVar14];
  *x = ((dVar20 * dVar20 + A[1] * dVar1) - dVar21 * dVar20) +
       (A[(ulong)uVar3 - 1] * A[(long)(int)(uVar3 - N) + -2] -
       A[(long)(int)(uVar3 - N) + -1] * A[(ulong)uVar3 - 2]);
  x[1] = ((dVar20 + A[lVar14 + 1]) - dVar21) * dVar1;
  x[2] = dVar1 * A[N * 2 + 1];
  if (2 < N) {
    iVar4 = 0;
    uVar13 = 0xffffffffffffffff;
    local_88 = A;
    local_68 = A;
    while( true ) {
      iVar11 = (int)uVar13;
      uVar9 = 0;
      if (0 < iVar11) {
        uVar9 = uVar13 & 0xffffffff;
      }
      if (iVar4 == N + -2) break;
      dVar20 = house(x,3,v);
      lVar19 = uVar13 + 4;
      lVar10 = 0;
      lVar5 = (long)iVar4;
      pdVar7 = local_88;
      for (lVar12 = lVar5; lVar15 = lVar10, uVar17 = uVar9, lVar12 < lVar19; lVar12 = lVar12 + 1) {
        for (; (long)uVar17 < lVar14; uVar17 = uVar17 + 1) {
          *(double *)((long)A_00 + (lVar15 >> 0x1d)) = pdVar7[uVar17];
          lVar15 = lVar15 + 0x300000000;
        }
        lVar10 = lVar10 + 0x100000000;
        pdVar7 = pdVar7 + lVar14;
      }
      iVar8 = N - (int)uVar9;
      mmult(A_00,v,C,iVar8,3,1);
      scale(C,iVar8,1,dVar20);
      mmult(v,C,A_00,3,1,iVar8);
      iVar8 = 0;
      pdVar7 = local_88;
      for (lVar12 = lVar5; uVar17 = uVar9, iVar2 = iVar8, lVar12 < lVar19; lVar12 = lVar12 + 1) {
        for (; (long)uVar17 < lVar14; uVar17 = uVar17 + 1) {
          pdVar7[uVar17] = pdVar7[uVar17] - A_00[iVar2];
          iVar2 = iVar2 + 1;
        }
        pdVar7 = pdVar7 + lVar14;
        iVar8 = iVar8 + (N - (int)uVar9);
      }
      iVar8 = iVar11 + 5;
      if ((long)(ulong)(N - 1) <= lVar19) {
        iVar8 = N;
      }
      lVar12 = 0;
      pdVar7 = local_68;
      for (lVar10 = 0; lVar15 = lVar12, pdVar6 = pdVar7, lVar18 = lVar5, lVar10 < iVar8;
          lVar10 = lVar10 + 1) {
        for (; lVar18 < lVar19; lVar18 = lVar18 + 1) {
          *(double *)((long)A_00 + (lVar15 >> 0x1d)) = *pdVar6;
          lVar15 = lVar15 + 0x100000000;
          pdVar6 = pdVar6 + 1;
        }
        pdVar7 = pdVar7 + lVar14;
        lVar12 = lVar12 + 0x300000000;
      }
      mmult(A_00,v,C,iVar8,3,1);
      scale(C,iVar8,1,dVar20);
      mmult(C,v,A_00,iVar8,1,3);
      lVar12 = 0;
      pdVar7 = local_68;
      for (lVar10 = 0; lVar15 = lVar12, pdVar6 = pdVar7, lVar18 = lVar5, lVar10 < iVar8;
          lVar10 = lVar10 + 1) {
        for (; lVar18 < lVar19; lVar18 = lVar18 + 1) {
          *pdVar6 = *pdVar6 - *(double *)((long)A_00 + (lVar15 >> 0x1d));
          lVar15 = lVar15 + 0x100000000;
          pdVar6 = pdVar6 + 1;
        }
        pdVar7 = pdVar7 + lVar14;
        lVar12 = lVar12 + 0x300000000;
      }
      *x = A[(uVar13 + 2) * lVar14 + uVar13 + 1];
      x[1] = A[(uVar13 + 3) * lVar14 + uVar13 + 1];
      if ((long)uVar13 < (long)(N + -4)) {
        x[2] = A[uVar13 + (long)((iVar11 + 4) * N) + 1];
      }
      uVar13 = uVar13 + 1;
      iVar4 = iVar4 + 1;
      local_88 = local_88 + lVar14;
      local_68 = local_68 + 1;
    }
    dVar20 = house(x,2,v);
    lVar10 = (long)(N + -3);
    lVar5 = (long)(N + -2);
    pdVar7 = A + lVar14 * lVar5;
    pdVar6 = A_00;
    for (lVar12 = lVar5; pdVar16 = pdVar6, lVar19 = lVar10, lVar12 != lVar14; lVar12 = lVar12 + 1) {
      for (; lVar14 != lVar19; lVar19 = lVar19 + 1) {
        *pdVar16 = pdVar7[lVar19];
        pdVar16 = pdVar16 + 2;
      }
      pdVar6 = pdVar6 + 1;
      pdVar7 = pdVar7 + lVar14;
    }
    nmult(A_00,v,C,3,2,1);
    scale(C,3,1,dVar20);
    nmult(v,C,A_00,2,1,3);
    pdVar6 = A + lVar14 * lVar5 + lVar10;
    pdVar7 = A_00;
    for (lVar12 = lVar5; lVar12 != lVar14; lVar12 = lVar12 + 1) {
      for (lVar19 = 0; lVar14 - lVar10 != lVar19; lVar19 = lVar19 + 1) {
        pdVar6[lVar19] = pdVar6[lVar19] - pdVar7[lVar19];
      }
      pdVar6 = pdVar6 + lVar14;
      pdVar7 = pdVar7 + 3;
    }
    pdVar7 = A + lVar5;
    iVar4 = -2;
    for (uVar13 = 0; uVar13 != (uint)N; uVar13 = uVar13 + 1) {
      for (lVar12 = 0; lVar14 - lVar5 != lVar12; lVar12 = lVar12 + 1) {
        A_00[(long)(iVar4 + 1 + (int)lVar12) + 1] = pdVar7[lVar12];
      }
      pdVar7 = pdVar7 + lVar14;
      iVar4 = iVar4 + 2;
    }
    mmult(A_00,v,C,N,2,1);
    scale(C,N,1,dVar20);
    mmult(C,v,A_00,N,1,2);
    pdVar7 = A + lVar5;
    iVar4 = -2;
    for (uVar13 = 0; uVar13 != (uint)N; uVar13 = uVar13 + 1) {
      for (lVar12 = 0; lVar14 - lVar5 != lVar12; lVar12 = lVar12 + 1) {
        pdVar7[lVar12] = pdVar7[lVar12] - A_00[(long)(iVar4 + 1 + (int)lVar12) + 1];
      }
      pdVar7 = pdVar7 + lVar14;
      iVar4 = iVar4 + 2;
    }
    free(x);
    free(v);
    free(A_00);
    free(C);
    return;
  }
  return;
}

Assistant:

void francisQR(double *A,int N) {
	int m,n,k,q,r,t,u,i,j;
	double s,t2,beta;
	double *x,*v,*AT,*w;
	int NN;
	/*
	 * Reference - Algorithm 7.5.1 Golub,van Loan Matrix Computations 3rd Edition
	 */ 
	x = (double*) malloc(sizeof(double) * 3);
	v = (double*) malloc(sizeof(double) * 3);
	AT = (double*) malloc(sizeof(double) * 3 * N);
	w = (double*) malloc(sizeof(double) * N);
	n = N-1;
	m = n-1;
	NN = N*N;
	
	s = A[NN-1] + A[NN-N-2];
	t2 = A[NN-1] * A[NN-N-2] - A[NN-2] * A[NN-N-1];
	
	x[0] = A[0]*A[0] + A[1]*A[N] - s*A[0] + t2;
	x[1] = A[N]*(A[0] + A[N+1] - s);
	x[2] = A[N] * A[N+N+1];
	if (N <= 2) {
		return;
	}
	
	for (k = -1; k < N - 3;++k) {
		
		beta = house(x,3,v);
		//mdisplay(x,3,1);
		if (k > 0) {
			q = k;
		} else {
			q = 0;
		}
		
		//printf("q %d \n",q);
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			u = 0;
			for (j=q; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=3;		
			}
		}
		
		mmult(AT,v,w,N-q,3,1);
		scale(w,N-q,1,beta);
		mmult(v,w,AT,3,1,N-q);
		
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			for (j=q; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-q) + j - q];
			}
		}
		//mdisplay(A,N,N);
		if (k+4 >= n) {
			r = N;
		} else {
			r = k+4+1;
		}
		//printf("r %d \n",r);
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		
		mmult(AT,v,w,r,3,1);
		scale(w,r,1,beta);
		mmult(w,v,AT,r,1,3);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		//mdisplay(A,N,N);
		x[0] = A[N*(k+2) + k+1];
		x[1] = A[N*(k+3) + k+1];
		
		if (k < n-3) {
			x[2] = A[N*(k+4) + k+1];
		} 
		//mdisplay(x,3,1);
		
	}
	//mdisplay(x,2,1);
	beta = house(x,2,v);
	
	for (i=n-1; i < N; i++) {
		t = i * N;
		u = 0;
		for (j=n-2; j < N; j++) {
			AT[u+i-n+1] = A[j+t];
			u+=2;		
		}
	}
	
	mmult(AT,v,w,3,2,1);
	scale(w,3,1,beta);
	mmult(v,w,AT,2,1,3);
	for (i=n-1; i < N; i++) {
		t = i * N;
		for (j=n-2; j < N; j++) {
			A[t+j] -= AT[(i-n+1)*3 + j - n + 2];
		}
	}
	
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			AT[u+j-n+1] = A[t+j];
		}
	}
	
	mmult(AT,v,w,N,2,1);
	scale(w,N,1,beta);
	mmult(w,v,AT,N,1,2);
		//mdisplay(AT,N,N-k-1);
		
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			A[t+j] -= AT[u+j-n+1];
		}
	}
	
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}